

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

leveldb * __thiscall leveldb::NumberToString_abi_cxx11_(leveldb *this,uint64_t num)

{
  uint64_t num_local;
  string *r;
  
  std::__cxx11::string::string((string *)this);
  AppendNumberTo((string *)this,num);
  return this;
}

Assistant:

std::string NumberToString(uint64_t num) {
  std::string r;
  AppendNumberTo(&r, num);
  return r;
}